

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall testing::Matcher<unsigned_char>::Matcher(Matcher<unsigned_char> *this,uchar value)

{
  _func_int **pp_Var1;
  linked_ptr<const_testing::MatcherInterface<const_unsigned_char_&>_> local_40;
  
  (this->super_MatcherBase<unsigned_char>).impl_.value_ =
       (MatcherInterface<const_unsigned_char_&> *)0x0;
  (this->super_MatcherBase<unsigned_char>).impl_.link_.next_ =
       &(this->super_MatcherBase<unsigned_char>).impl_.link_;
  (this->super_MatcherBase<unsigned_char>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001ad070;
  pp_Var1 = (_func_int **)operator_new(0x10);
  *pp_Var1 = (_func_int *)&PTR__MatcherDescriberInterface_001afc18;
  *(uchar *)(pp_Var1 + 1) = value;
  local_40.value_ = (MatcherInterface<const_unsigned_char_&> *)operator_new(0x10);
  ((local_40.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherInterfaceAdapter_001afbb0;
  local_40.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = pp_Var1;
  local_40.link_.next_ = &local_40.link_;
  internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_char_&>_>::operator=
            (&(this->super_MatcherBase<unsigned_char>).impl_,&local_40);
  internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_char_&>_>::~linked_ptr
            (&local_40);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }